

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O0

void __thiscall
cmCommandArgumentParserHelper::~cmCommandArgumentParserHelper(cmCommandArgumentParserHelper *this)

{
  cmCommandArgumentParserHelper *this_local;
  
  CleanupParser(this);
  std::__cxx11::string::~string((string *)&this->ErrorString);
  std::__cxx11::string::~string((string *)&this->Result);
  std::vector<char_*,_std::allocator<char_*>_>::~vector(&this->Variables);
  std::vector<char,_std::allocator<char>_>::~vector(&this->OutputBuffer);
  std::__cxx11::string::~string((string *)&this->InputBuffer);
  return;
}

Assistant:

cmCommandArgumentParserHelper::~cmCommandArgumentParserHelper()
{
  this->CleanupParser();
}